

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

Curl_hash_element * Curl_hash_next_element(Curl_hash_iterator *iter)

{
  Curl_hash *pCVar1;
  Curl_llist_node *pCVar2;
  Curl_hash_element *pCVar3;
  size_t sVar4;
  long lVar5;
  
  pCVar1 = iter->hash;
  if (pCVar1->table != (Curl_llist *)0x0) {
    if (iter->current_element != (Curl_llist_node *)0x0) {
      pCVar2 = Curl_node_next(iter->current_element);
      iter->current_element = pCVar2;
      if (pCVar2 != (Curl_llist_node *)0x0) goto LAB_0012d459;
    }
    sVar4 = iter->slot_index;
    lVar5 = sVar4 << 5;
    for (; sVar4 < pCVar1->slots; sVar4 = sVar4 + 1) {
      pCVar2 = Curl_llist_head((Curl_llist *)((long)&pCVar1->table->_head + lVar5));
      if (pCVar2 != (Curl_llist_node *)0x0) {
        pCVar2 = Curl_llist_head((Curl_llist *)((long)&pCVar1->table->_head + lVar5));
        iter->current_element = pCVar2;
        iter->slot_index = sVar4 + 1;
        goto LAB_0012d454;
      }
      lVar5 = lVar5 + 0x20;
    }
    pCVar2 = iter->current_element;
LAB_0012d454:
    if (pCVar2 != (Curl_llist_node *)0x0) {
LAB_0012d459:
      pCVar3 = (Curl_hash_element *)Curl_node_elem(pCVar2);
      return pCVar3;
    }
  }
  return (Curl_hash_element *)0x0;
}

Assistant:

struct Curl_hash_element *
Curl_hash_next_element(struct Curl_hash_iterator *iter)
{
  struct Curl_hash *h;
  DEBUGASSERT(iter->init == ITERINIT);
  h = iter->hash;
  if(!h->table)
    return NULL; /* empty hash, nothing to return */

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = Curl_node_next(iter->current_element);

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    size_t i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(Curl_llist_head(&h->table[i])) {
        iter->current_element = Curl_llist_head(&h->table[i]);
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct Curl_hash_element *he = Curl_node_elem(iter->current_element);
    return he;
  }
  return NULL;
}